

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::TrimWhitespace(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = (s->_M_dataplus)._M_p;
  sVar1 = s->_M_string_length;
  sVar2 = sVar1;
  pcVar4 = pcVar3;
  if (sVar1 == 0) {
LAB_001251f0:
    if (pcVar4 != pcVar3 + sVar1) {
      pcVar3 = pcVar3 + sVar1 + 1;
      do {
        pcVar4 = pcVar3 + -2;
        pcVar3 = pcVar3 + -1;
      } while (*pcVar4 < '!');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  else {
    do {
      if (' ' < *pcVar4) goto LAB_001251f0;
      sVar2 = sVar2 - 1;
      pcVar4 = pcVar4 + 1;
    } while (sVar2 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while(start != s.end() && *start <= ' ')
    ++start;
  if (start == s.end())
    return "";

  std::string::const_iterator stop = s.end()-1;
  while(*stop <= ' ')
    --stop;
  return std::string(start, stop+1);
}